

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h,Allocator *allocator,int num_threads)

{
  int _c;
  int c;
  Mat resizem;
  Mat m;
  Mat local_a0;
  Mat local_68;
  
  if ((src->w == w) && (src->h == h)) {
    Mat::operator=(dst,src);
    return;
  }
  if (src->dims == 3) {
    _c = src->c;
    Mat::create(dst,w,h,_c,src->elemsize,allocator);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      c = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; _c != c; c = c + 1) {
        Mat::channel(&local_68,src,c);
        Mat::channel(&local_a0,dst,c);
        resize_bilinear_image(&local_68,&local_a0,w,h);
        Mat::~Mat(&local_a0);
        Mat::~Mat(&local_68);
      }
    }
  }
  else if (src->dims == 2) {
    Mat::create(dst,w,h,src->elemsize,allocator);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      resize_bilinear_image(src,dst,w,h);
      return;
    }
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h, Allocator* allocator, int num_threads)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    size_t elemsize = src.elemsize;

    if (src.dims == 2)
    {
        dst.create(w, h, elemsize, allocator);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels, elemsize, allocator);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for num_threads(num_threads)
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}